

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

string * __thiscall
ser::OffsetTable::ToString_abi_cxx11_(string *__return_storage_ptr__,OffsetTable *this)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference this_00;
  pointer ppVar4;
  double dVar5;
  _Self local_1e8;
  _Self local_1e0;
  const_iterator iter;
  OffsetTableEntry *entry;
  int local_1ac;
  int local_1a8;
  int i;
  ostringstream local_198 [8];
  ostringstream ss;
  int width;
  int size;
  OffsetTable *this_local;
  
  sVar2 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::size(&this->savepoints_);
  dVar5 = log10((double)(int)sVar2);
  dVar5 = ceil(dVar5);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"OffsetTable {\n");
  for (local_1a8 = 0; local_1a8 < (int)sVar2; local_1a8 = local_1a8 + 1) {
    poVar3 = std::operator<<((ostream *)local_198,"  ");
    local_1ac = (int)std::setw((int)dVar5);
    poVar3 = std::operator<<(poVar3,(_Setw)local_1ac);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a8);
    poVar3 = std::operator<<(poVar3,": ");
    this_00 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                        (&this->savepoints_,(long)local_1a8);
    Savepoint::ToString_abi_cxx11_((string *)&entry,this_00);
    poVar3 = std::operator<<(poVar3,(string *)&entry);
    std::operator<<(poVar3,"  ");
    std::__cxx11::string::~string((string *)&entry);
    iter._M_node = (_Base_ptr)
                   std::
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                   ::operator[](&this->entries_,(long)local_1a8);
    std::operator<<((ostream *)local_198,"( ");
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
         ::begin(iter._M_node);
    while( true ) {
      local_1e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
           ::end(iter._M_node);
      bVar1 = std::operator!=(&local_1e0,&local_1e8);
      if (!bVar1) break;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
               ::operator->(&local_1e0);
      poVar3 = std::operator<<((ostream *)local_198,(string *)ppVar4);
      poVar3 = std::operator<<(poVar3,":");
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
               ::operator->(&local_1e0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ppVar4->second).offset);
      std::operator<<(poVar3," ");
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
      ::operator++(&local_1e0);
    }
    std::operator<<((ostream *)local_198,")\n");
  }
  std::operator<<((ostream *)local_198,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string OffsetTable::ToString() const
{
    const int size = savepoints_.size();
    const int width = std::ceil(std::log10(static_cast<double>(size)));

    std::ostringstream ss;

    ss << "OffsetTable {\n";
    for (int i = 0; i < size; ++i)
    {
        // Print savepoint
        ss << "  " << std::setw(width) << i << ": " << savepoints_[i].ToString() << "  ";

        // Print offsets
        const OffsetTableEntry& entry = entries_[i];
        ss << "( ";
        for (const_iterator iter = entry.begin(); iter != entry.end(); ++iter)
            ss << iter->first << ":" << iter->second.offset << " ";
        ss << ")\n";
    }
    ss << "}\n";

    return ss.str();
}